

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O1

void __thiscall duckdb::PartitionedColumnData::CreateAllocator(PartitionedColumnData *this)

{
  PartitionColumnDataAllocators *pPVar1;
  BufferManager *__args;
  reference this_00;
  ColumnDataAllocator *pCVar2;
  undefined1 local_39;
  shared_ptr<duckdb::ColumnDataAllocator,_true> local_38;
  ColumnDataAllocator *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  pPVar1 = shared_ptr<duckdb::PartitionColumnDataAllocators,_true>::operator->(&this->allocators);
  __args = BufferManager::GetBufferManager(this->context);
  local_28 = (ColumnDataAllocator *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ColumnDataAllocator,std::allocator<duckdb::ColumnDataAllocator>,duckdb::BufferManager&>
            (&local_20,&local_28,(allocator<duckdb::ColumnDataAllocator> *)&local_39,__args);
  local_38.internal.super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_28;
  local_38.internal.super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>>
            ((vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>>>
              *)&pPVar1->allocators,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.
               super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pPVar1 = shared_ptr<duckdb::PartitionColumnDataAllocators,_true>::operator->(&this->allocators);
  this_00 = vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,_true>,_true>::back
                      (&pPVar1->allocators);
  pCVar2 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(this_00);
  pCVar2->shared = true;
  return;
}

Assistant:

void PartitionedColumnData::CreateAllocator() {
	allocators->allocators.emplace_back(make_shared_ptr<ColumnDataAllocator>(BufferManager::GetBufferManager(context)));
	allocators->allocators.back()->MakeShared();
}